

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

bool google::protobuf::compiler::ApplyMapping
               (string_view filename,string_view old_prefix,string_view new_prefix,string *result)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  byte unaff_BL;
  size_type __rlen;
  short *__s1;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  size_type __rlen_1;
  bool bVar9;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  long local_48 [2];
  short *local_38;
  
  pcVar8 = new_prefix._M_str;
  sVar6 = new_prefix._M_len;
  uVar4 = old_prefix._M_len;
  __s1 = (short *)filename._M_str;
  uVar5 = filename._M_len;
  if (uVar4 == 0) {
    if (((uVar5 != 2) || (iVar1 = bcmp(__s1,"..",2), iVar1 != 0)) &&
       ((uVar5 < 3 ||
        (((char)__s1[1] != '/' || *__s1 != 0x2e2e &&
         ((uVar5 < 3 ||
          (*(char *)((long)__s1 + (uVar5 - 1)) != '.' ||
           *(short *)((long)__s1 + (uVar5 - 3)) != 0x2e2f)))))))) {
      unaff_BL = 0;
      local_58._M_len = uVar5;
      local_58._M_str = (char *)__s1;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_58,"/../",0,4);
      if (sVar3 != 0xffffffffffffffff) goto LAB_001f7fc2;
      if ((uVar5 == 0) || ((char)*__s1 != '/')) {
        local_58._M_len = (size_t)local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar8,pcVar8 + sVar6);
        std::__cxx11::string::operator=((string *)result,(string *)&local_58);
        if ((long *)local_58._M_len != local_48) {
          operator_delete((void *)local_58._M_len,local_48[0] + 1);
        }
        if (result->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)result);
        }
        local_58._M_len = (size_t)local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,__s1,(char *)(uVar5 + (long)__s1));
        std::__cxx11::string::_M_append((char *)result,local_58._M_len);
        if ((long *)local_58._M_len != local_48) goto LAB_001f7e36;
        goto LAB_001f7e43;
      }
    }
  }
  else if ((uVar4 <= uVar5) && (iVar1 = bcmp(__s1,old_prefix._M_str,uVar4), iVar1 == 0)) {
    if (uVar5 == uVar4) {
      local_58._M_len = (size_t)local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar8,pcVar8 + sVar6);
      std::__cxx11::string::operator=((string *)result,(string *)&local_58);
      if ((long *)local_58._M_len != local_48) {
LAB_001f7e36:
        operator_delete((void *)local_58._M_len,local_48[0] + 1);
      }
LAB_001f7e43:
      unaff_BL = 1;
      goto LAB_001f7fc2;
    }
    if (*(char *)((long)__s1 + uVar4) == '/') {
      iVar1 = (int)old_prefix._M_len + 1;
    }
    else {
      iVar1 = -1;
      if (*(char *)((long)__s1 + (uVar4 - 1)) == '/') {
        iVar1 = (int)old_prefix._M_len;
      }
    }
    if (iVar1 != -1) {
      uVar7 = (ulong)iVar1;
      uVar4 = uVar5 - uVar7;
      if (uVar5 < uVar7) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar7,uVar5);
      }
      local_38 = (short *)(uVar7 + (long)__s1);
      if ((uVar4 == 2) && (iVar2 = bcmp(local_38,"..",2), iVar2 == 0)) {
        bVar9 = true;
      }
      else if ((uVar4 < 3) ||
              ((bVar9 = true, (char)local_38[1] != '/' || *local_38 != 0x2e2e &&
               ((uVar4 < 3 ||
                (*(char *)((long)__s1 + (uVar5 - 1)) != '.' ||
                 *(short *)((long)__s1 + (uVar5 - 3)) != 0x2e2f)))))) {
        local_58._M_len = uVar4;
        local_58._M_str = (char *)local_38;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_58,"/../",0,4);
        bVar9 = sVar3 != 0xffffffffffffffff;
      }
      if (bVar9 == false) {
        local_58._M_len = (size_t)local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar8,pcVar8 + sVar6);
        std::__cxx11::string::operator=((string *)result,(string *)&local_58);
        if ((long *)local_58._M_len != local_48) {
          operator_delete((void *)local_58._M_len,local_48[0] + 1);
        }
        if (result->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)result);
        }
        local_58._M_len = (size_t)local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,local_38,(char *)((long)__s1 + uVar5));
        std::__cxx11::string::_M_append((char *)result,local_58._M_len);
        if ((long *)local_58._M_len != local_48) {
          operator_delete((void *)local_58._M_len,local_48[0] + 1);
        }
      }
      unaff_BL = bVar9 ^ 1;
    }
    if (iVar1 != -1) goto LAB_001f7fc2;
  }
  unaff_BL = 0;
LAB_001f7fc2:
  return (bool)(unaff_BL & 1);
}

Assistant:

static bool ApplyMapping(absl::string_view filename,
                         absl::string_view old_prefix,
                         absl::string_view new_prefix, std::string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (absl::StartsWith(filename, "/") || IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(std::string(new_prefix));
    if (!result->empty()) result->push_back('/');
    result->append(std::string(filename));
    return true;
  } else if (absl::StartsWith(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = std::string(new_prefix);
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        absl::string_view after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(std::string(new_prefix));
        if (!result->empty()) result->push_back('/');
        result->append(std::string(after_prefix));
        return true;
      }
    }
  }

  return false;
}